

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test4::verifyProgramInterfaceQuerySupport(GPUShaderFP64Test4 *this)

{
  _stage_data *__s;
  code *pcVar1;
  uint uVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  char *pcVar7;
  undefined8 uVar8;
  ulong uVar9;
  void *__s2;
  TestLog *pTVar10;
  MessageBuilder *pMVar11;
  TestError *this_00;
  _program_interface_query_test_item *local_bc8;
  MessageBuilder local_918;
  MessageBuilder local_798;
  MessageBuilder local_618;
  uint local_494;
  GLenum GStack_490;
  GLuint resource_index;
  GLint temp_buffer [2];
  GLenum retrieved_type;
  GLint retrieved_name_length;
  GLint retrieved_array_size;
  GLint n_written_items;
  _program_interface_query_test_item *current_item_1;
  undefined4 local_468;
  uint n_uniform_1;
  uint n_properties;
  GLenum properties [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  GLenum *local_418;
  _program_interface_query_test_item *current_item;
  undefined4 local_408;
  uint n_uniform;
  uint n_uniforms;
  allocator<char> local_3fc;
  allocator<char> local_3fb;
  allocator<char> local_3fa;
  allocator<char> local_3f9;
  allocator<char> local_3f8;
  allocator<char> local_3f7;
  allocator<char> local_3f6;
  allocator<char> local_3f5 [20];
  allocator<char> local_3e1;
  GLenum *local_3e0;
  undefined1 local_3d8 [8];
  _program_interface_query_test_item uniforms [16];
  char *stage_prefix;
  _stage_data *stage_ptr;
  uint n_stage;
  GLint max_uniform_name_length;
  _stage_data **stage_data;
  char **stage_prefixes;
  uint n_stages;
  GLuint po_id;
  uint n_program;
  uint n_programs;
  GLuint programs [2];
  uint n_noncs_stages;
  uint n_cs_stages;
  _stage_data *noncs_stages [5];
  _stage_data *local_58;
  char *noncs_prefixes [5];
  _stage_data *cs_stages [1];
  char *cs_prefixes [1];
  bool result;
  Functions *gl;
  GPUShaderFP64Test4 *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  cs_prefixes[0]._7_1_ = true;
  cs_stages[0] = (_stage_data *)0x29c0cca;
  noncs_prefixes[4] = (char *)&this->m_data_cs;
  memcpy(&local_58,&DAT_0323dfb0,0x28);
  _n_noncs_stages = &this->m_data_fs;
  noncs_stages[0] = &this->m_data_gs;
  noncs_stages[1] = &this->m_data_tc;
  noncs_stages[2] = &this->m_data_te;
  noncs_stages[3] = &this->m_data_vs;
  programs[1] = 1;
  programs[0] = 5;
  n_program = this->m_po_cs_id;
  n_programs = this->m_po_noncs_id;
  po_id = 2;
  n_stages = 0;
  do {
    if (1 < n_stages) {
      return cs_prefixes[0]._7_1_;
    }
    stage_prefixes._4_4_ = (&n_program)[n_stages];
    if (stage_prefixes._4_4_ == this->m_po_cs_id) {
      stage_prefixes._0_4_ = 1;
      _n_stage = noncs_prefixes + 4;
      stage_data = cs_stages;
    }
    else {
      stage_prefixes._0_4_ = 5;
      _n_stage = (char **)&n_noncs_stages;
      stage_data = &local_58;
    }
    if (stage_prefixes._4_4_ != 0) {
      stage_ptr._4_4_ = 0;
      (**(code **)(lVar6 + 0x990))(stage_prefixes._4_4_,0x92e1,0x92f6,(long)&stage_ptr + 4);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glGetProgramInterfaceiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x1a93);
      pcVar7 = (char *)operator_new__((long)stage_ptr._4_4_);
      this->m_uniform_name_buffer = pcVar7;
      for (stage_ptr._0_4_ = 0; (uint)stage_ptr < (uint)stage_prefixes;
          stage_ptr._0_4_ = (uint)stage_ptr + 1) {
        pcVar7 = _n_stage[(uint)stage_ptr];
        __s = stage_data[(uint)stage_ptr];
        n_uniform._0_1_ = 1;
        local_3e0 = (GLenum *)local_3d8;
        local_3d8._0_4_ = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)uniforms,"double",&local_3e1);
        uniforms[0].name.field_2._8_4_ = 0x140a;
        uniforms[0].name.field_2._12_4_ = *(undefined4 *)(pcVar7 + 0x330);
        local_3e0 = &uniforms[0].expected_type;
        uniforms[0].expected_type = 2;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(uniforms + 1),"double_arr[0]",local_3f5);
        uniforms[1].name.field_2._8_4_ = 0x140a;
        uniforms[1].name.field_2._12_4_ = *(undefined4 *)(pcVar7 + 0x334);
        local_3e0 = &uniforms[1].expected_type;
        uniforms[1].expected_type = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(uniforms + 2),"dvec2",&local_3f6);
        uniforms[2].name.field_2._8_4_ = 0x8ffc;
        uniforms[2].name.field_2._12_4_ = *(undefined4 *)(pcVar7 + 0x33c);
        local_3e0 = &uniforms[2].expected_type;
        uniforms[2].expected_type = 2;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(uniforms + 3),"dvec2_arr[0]",&local_3f7);
        uniforms[3].name.field_2._8_4_ = 0x8ffc;
        uniforms[3].name.field_2._12_4_ = *(undefined4 *)(pcVar7 + 0x340);
        local_3e0 = &uniforms[3].expected_type;
        uniforms[3].expected_type = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(uniforms + 4),"dvec3",&local_3f8);
        uniforms[4].name.field_2._8_4_ = 0x8ffd;
        uniforms[4].name.field_2._12_4_ = *(undefined4 *)(pcVar7 + 0x348);
        local_3e0 = &uniforms[4].expected_type;
        uniforms[4].expected_type = 2;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(uniforms + 5),"dvec3_arr[0]",&local_3f9);
        uniforms[5].name.field_2._8_4_ = 0x8ffd;
        uniforms[5].name.field_2._12_4_ = *(undefined4 *)(pcVar7 + 0x34c);
        local_3e0 = &uniforms[5].expected_type;
        uniforms[5].expected_type = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(uniforms + 6),"dvec4",&local_3fa);
        uniforms[6].name.field_2._8_4_ = 0x8ffe;
        uniforms[6].name.field_2._12_4_ = *(undefined4 *)(pcVar7 + 0x354);
        local_3e0 = &uniforms[6].expected_type;
        uniforms[6].expected_type = 2;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(uniforms + 7),"dvec4_arr[0]",&local_3fb);
        uniforms[7].name.field_2._8_4_ = 0x8ffe;
        uniforms[7].name.field_2._12_4_ = *(undefined4 *)(pcVar7 + 0x358);
        local_3e0 = &uniforms[7].expected_type;
        uniforms[7].expected_type = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(uniforms + 8),"array[0].struct_double",&local_3fc);
        uniforms[8].name.field_2._8_4_ = 0x140a;
        uniforms[8].name.field_2._12_4_ = *(undefined4 *)(pcVar7 + 0xf0);
        local_3e0 = &uniforms[8].expected_type;
        uniforms[8].expected_type = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(uniforms + 9),"array[0].struct_dvec2",
                   (allocator<char> *)((long)&n_uniforms + 3));
        uniforms[9].name.field_2._8_4_ = 0x8ffc;
        uniforms[9].name.field_2._12_4_ = *(undefined4 *)(pcVar7 + 0xfc);
        local_3e0 = &uniforms[9].expected_type;
        uniforms[9].expected_type = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(uniforms + 10),"array[0].struct_dvec3",
                   (allocator<char> *)((long)&n_uniforms + 2));
        uniforms[10].name.field_2._8_4_ = 0x8ffd;
        uniforms[10].name.field_2._12_4_ = *(undefined4 *)(pcVar7 + 0x108);
        local_3e0 = &uniforms[10].expected_type;
        uniforms[10].expected_type = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(uniforms + 0xb),"array[0].struct_dvec4",
                   (allocator<char> *)((long)&n_uniforms + 1));
        uniforms[0xb].name.field_2._8_4_ = 0x8ffe;
        uniforms[0xb].name.field_2._12_4_ = *(undefined4 *)(pcVar7 + 0x114);
        local_3e0 = &uniforms[0xb].expected_type;
        uniforms[0xb].expected_type = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(uniforms + 0xc),"array[1].struct_double",
                   (allocator<char> *)&n_uniforms);
        uniforms[0xc].name.field_2._8_4_ = 0x140a;
        uniforms[0xc].name.field_2._12_4_ = *(undefined4 *)(pcVar7 + 0xf0);
        local_3e0 = &uniforms[0xc].expected_type;
        uniforms[0xc].expected_type = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(uniforms + 0xd),"array[1].struct_dvec2",
                   (allocator<char> *)((long)&n_uniform + 3));
        uniforms[0xd].name.field_2._8_4_ = 0x8ffc;
        uniforms[0xd].name.field_2._12_4_ = *(undefined4 *)(pcVar7 + 0xfc);
        local_3e0 = &uniforms[0xd].expected_type;
        uniforms[0xd].expected_type = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(uniforms + 0xe),"array[1].struct_dvec3",
                   (allocator<char> *)((long)&n_uniform + 2));
        uniforms[0xe].name.field_2._8_4_ = 0x8ffd;
        uniforms[0xe].name.field_2._12_4_ = *(undefined4 *)(pcVar7 + 0x108);
        local_3e0 = &uniforms[0xe].expected_type;
        uniforms[0xe].expected_type = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(uniforms + 0xf),"array[1].struct_dvec4",
                   (allocator<char> *)((long)&n_uniform + 1));
        uniforms[0xf].name.field_2._8_4_ = 0x8ffe;
        uniforms[0xf].name.field_2._12_4_ = *(undefined4 *)(pcVar7 + 0x114);
        n_uniform._0_1_ = 0;
        std::allocator<char>::~allocator((allocator<char> *)((long)&n_uniform + 1));
        std::allocator<char>::~allocator((allocator<char> *)((long)&n_uniform + 2));
        std::allocator<char>::~allocator((allocator<char> *)((long)&n_uniform + 3));
        std::allocator<char>::~allocator((allocator<char> *)&n_uniforms);
        std::allocator<char>::~allocator((allocator<char> *)((long)&n_uniforms + 1));
        std::allocator<char>::~allocator((allocator<char> *)((long)&n_uniforms + 2));
        std::allocator<char>::~allocator((allocator<char> *)((long)&n_uniforms + 3));
        std::allocator<char>::~allocator(&local_3fc);
        std::allocator<char>::~allocator(&local_3fb);
        std::allocator<char>::~allocator(&local_3fa);
        std::allocator<char>::~allocator(&local_3f9);
        std::allocator<char>::~allocator(&local_3f8);
        std::allocator<char>::~allocator(&local_3f7);
        std::allocator<char>::~allocator(&local_3f6);
        std::allocator<char>::~allocator(local_3f5);
        std::allocator<char>::~allocator(&local_3e1);
        local_408 = 0x10;
        for (current_item._4_4_ = 0; current_item._4_4_ < 0x10;
            current_item._4_4_ = current_item._4_4_ + 1) {
          local_418 = &uniforms[(ulong)current_item._4_4_ - 1].expected_type;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(properties + 1),(char *)__s,
                     (allocator<char> *)((long)properties + 3));
          std::operator+(&local_438,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (properties + 1),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_418 + 2));
          std::__cxx11::string::operator=((string *)(local_418 + 2),(string *)&local_438);
          std::__cxx11::string::~string((string *)&local_438);
          std::__cxx11::string::~string((string *)(properties + 1));
          std::allocator<char>::~allocator((allocator<char> *)((long)properties + 3));
        }
        _n_uniform_1 = 0x92fa000092fb;
        local_468 = 2;
        for (current_item_1._4_4_ = 0; uVar2 = stage_prefixes._4_4_, current_item_1._4_4_ < 0x10;
            current_item_1._4_4_ = current_item_1._4_4_ + 1) {
          _retrieved_array_size = &uniforms[(ulong)current_item_1._4_4_ - 1].expected_type;
          retrieved_name_length = 0;
          retrieved_type = 0;
          temp_buffer[1] = 0;
          temp_buffer[0] = 0;
          _GStack_490 = 0;
          pcVar1 = *(code **)(lVar6 + 0x9a8);
          uVar8 = std::__cxx11::string::c_str();
          local_494 = (*pcVar1)(uVar2,0x92e1,uVar8);
          dVar4 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar4,"glGetProgramResourceIndex() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                          ,0x1ad2);
          memset(this->m_uniform_name_buffer,0,(long)stage_ptr._4_4_);
          (**(code **)(lVar6 + 0x9c0))
                    (stage_prefixes._4_4_,0x92e1,local_494,stage_ptr._4_4_,temp_buffer + 1,
                     this->m_uniform_name_buffer);
          dVar4 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar4,"glGetProgramResourceName() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                          ,0x1ada);
          uVar9 = std::__cxx11::string::length();
          if (uVar9 == (uint)temp_buffer[1]) {
            pcVar7 = this->m_uniform_name_buffer;
            __s2 = (void *)std::__cxx11::string::c_str();
            iVar3 = memcmp(pcVar7,__s2,(long)temp_buffer[1]);
            if (iVar3 != 0) goto LAB_00fa12fd;
            (**(code **)(lVar6 + 0x9c8))
                      (stage_prefixes._4_4_,0x92e1,local_494,2,&n_uniform_1,2,&retrieved_name_length
                       ,&GStack_490);
            dVar4 = (**(code **)(lVar6 + 0x800))();
            glu::checkError(dVar4,"glGetProgramResourceiv() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                            ,0x1aee);
            if (retrieved_name_length != 2) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,
                         "Invalid amount of items were reported by glGetProgramResourceiv() call.",
                         (char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                         ,0x1af2);
              __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
            retrieved_type = GStack_490;
            temp_buffer[0] = resource_index;
            if (GStack_490 != *_retrieved_array_size) {
              pTVar10 = tcu::TestContext::getLog
                                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        (&local_798,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar11 = tcu::MessageBuilder::operator<<
                                  (&local_798,
                                   (char (*) [42])"Invalid array size reported for uniform [");
              pMVar11 = tcu::MessageBuilder::operator<<
                                  (pMVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(_retrieved_array_size + 2));
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x29ea7ce);
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a02936);
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(int *)_retrieved_array_size);
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [14])"], reported:[");
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(int *)&retrieved_type);
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x29ea7ce);
              tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_798);
              cs_prefixes[0]._7_1_ = false;
            }
            if (temp_buffer[0] != _retrieved_array_size[10]) {
              pTVar10 = tcu::TestContext::getLog
                                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        (&local_918,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar11 = tcu::MessageBuilder::operator<<
                                  (&local_918,(char (*) [36])"Invalid type reported for uniform [");
              pMVar11 = tcu::MessageBuilder::operator<<
                                  (pMVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(_retrieved_array_size + 2));
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x29ea7ce);
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a02936);
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,_retrieved_array_size + 10);
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [14])"], reported:[");
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(uint *)temp_buffer);
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x29ea7ce);
              tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_918);
              cs_prefixes[0]._7_1_ = false;
            }
          }
          else {
LAB_00fa12fd:
            pTVar10 = tcu::TestContext::getLog
                                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_618,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar11 = tcu::MessageBuilder::operator<<
                                (&local_618,
                                 (char (*) [45])"Invalid uniform name was reported at index [");
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_494);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [14])"]: expected:[");
            pMVar11 = tcu::MessageBuilder::operator<<
                                (pMVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(_retrieved_array_size + 2));
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [14])"], reported:[");
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&this->m_uniform_name_buffer);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x29ea7ce);
            tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_618);
            cs_prefixes[0]._7_1_ = false;
          }
        }
        local_bc8 = (_program_interface_query_test_item *)&uniforms[0xf].expected_type;
        do {
          local_bc8 = local_bc8 + -1;
          _program_interface_query_test_item::~_program_interface_query_test_item(local_bc8);
        } while (local_bc8 != (_program_interface_query_test_item *)local_3d8);
      }
      if (this->m_uniform_name_buffer != (char *)0x0) {
        if (this->m_uniform_name_buffer != (char *)0x0) {
          operator_delete__(this->m_uniform_name_buffer);
        }
        this->m_uniform_name_buffer = (char *)0x0;
      }
    }
    n_stages = n_stages + 1;
  } while( true );
}

Assistant:

bool GPUShaderFP64Test4::verifyProgramInterfaceQuerySupport()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Iterate through all programs */
	const char*		   cs_prefixes[]	= { "cs_" };
	_stage_data*	   cs_stages[]		= { &m_data_cs };
	const char*		   noncs_prefixes[] = { "fs_", "gs_", "tc_", "te_", "vs_" };
	_stage_data*	   noncs_stages[]   = { &m_data_fs, &m_data_gs, &m_data_tc, &m_data_te, &m_data_vs };
	const unsigned int n_cs_stages		= sizeof(cs_stages) / sizeof(cs_stages[0]);
	const unsigned int n_noncs_stages   = sizeof(noncs_stages) / sizeof(noncs_stages[0]);

	const glw::GLuint  programs[] = { m_po_cs_id, m_po_noncs_id };
	const unsigned int n_programs = sizeof(programs) / sizeof(programs[0]);

	for (unsigned int n_program = 0; n_program < n_programs; ++n_program)
	{
		glw::GLuint   po_id			 = programs[n_program];
		unsigned int  n_stages		 = 0;
		const char**  stage_prefixes = DE_NULL;
		_stage_data** stage_data	 = DE_NULL;

		if (po_id == m_po_cs_id)
		{
			n_stages	   = n_cs_stages;
			stage_data	 = cs_stages;
			stage_prefixes = cs_prefixes;
		}
		else
		{
			n_stages	   = n_noncs_stages;
			stage_data	 = noncs_stages;
			stage_prefixes = noncs_prefixes;
		}

		/* Skip compute shader program if not supported */
		if (0 == po_id)
		{
			continue;
		}

		/* Determine maximum uniform name length */
		glw::GLint max_uniform_name_length = 0;

		gl.getProgramInterfaceiv(po_id, GL_UNIFORM, GL_MAX_NAME_LENGTH, &max_uniform_name_length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInterfaceiv() call failed.");

		/* Allocate a buffer we will use to hold uniform names */
		m_uniform_name_buffer = new char[max_uniform_name_length];

		for (unsigned int n_stage = 0; n_stage < n_stages; ++n_stage)
		{
			/* Iterate through all uniforms */
			_stage_data* stage_ptr	= stage_data[n_stage];
			const char*  stage_prefix = stage_prefixes[n_stage];

			/* Construct an array that will be used to run the test in an automated manner */
			_program_interface_query_test_item uniforms[] = {
				/* array size */ /* name */ /* type */ /* location */
				{ 1, "double", GL_DOUBLE, stage_ptr->uniforms.uniform_location_double },
				{ 2, "double_arr[0]", GL_DOUBLE, stage_ptr->uniforms.uniform_location_double_arr[0] },
				{ 1, "dvec2", GL_DOUBLE_VEC2, stage_ptr->uniforms.uniform_location_dvec2 },
				{ 2, "dvec2_arr[0]", GL_DOUBLE_VEC2, stage_ptr->uniforms.uniform_location_dvec2_arr[0] },
				{ 1, "dvec3", GL_DOUBLE_VEC3, stage_ptr->uniforms.uniform_location_dvec3 },
				{ 2, "dvec3_arr[0]", GL_DOUBLE_VEC3, stage_ptr->uniforms.uniform_location_dvec3_arr[0] },
				{ 1, "dvec4", GL_DOUBLE_VEC4, stage_ptr->uniforms.uniform_location_dvec4 },
				{ 2, "dvec4_arr[0]", GL_DOUBLE_VEC4, stage_ptr->uniforms.uniform_location_dvec4_arr[0] },
				{ 1, "array[0].struct_double", GL_DOUBLE,
				  stage_ptr->uniform_structure_arrays->uniform_location_double },
				{ 1, "array[0].struct_dvec2", GL_DOUBLE_VEC2,
				  stage_ptr->uniform_structure_arrays->uniform_location_dvec2 },
				{ 1, "array[0].struct_dvec3", GL_DOUBLE_VEC3,
				  stage_ptr->uniform_structure_arrays->uniform_location_dvec3 },
				{ 1, "array[0].struct_dvec4", GL_DOUBLE_VEC4,
				  stage_ptr->uniform_structure_arrays->uniform_location_dvec4 },
				{ 1, "array[1].struct_double", GL_DOUBLE,
				  stage_ptr->uniform_structure_arrays->uniform_location_double },
				{ 1, "array[1].struct_dvec2", GL_DOUBLE_VEC2,
				  stage_ptr->uniform_structure_arrays->uniform_location_dvec2 },
				{ 1, "array[1].struct_dvec3", GL_DOUBLE_VEC3,
				  stage_ptr->uniform_structure_arrays->uniform_location_dvec3 },
				{ 1, "array[1].struct_dvec4", GL_DOUBLE_VEC4,
				  stage_ptr->uniform_structure_arrays->uniform_location_dvec4 },
			};
			const unsigned int n_uniforms = sizeof(uniforms) / sizeof(uniforms[0]);

			/* Prefix the names with stage-specific string */
			for (unsigned int n_uniform = 0; n_uniform < n_uniforms; ++n_uniform)
			{
				_program_interface_query_test_item& current_item = uniforms[n_uniform];

				current_item.name = std::string(stage_prefix) + current_item.name;
			} /* for (all uniform descriptors) */

			const glw::GLenum  properties[] = { GL_ARRAY_SIZE, GL_TYPE };
			const unsigned int n_properties = sizeof(properties) / sizeof(properties[0]);

			for (unsigned int n_uniform = 0; n_uniform < n_uniforms; ++n_uniform)
			{
				_program_interface_query_test_item& current_item		  = uniforms[n_uniform];
				glw::GLint							n_written_items		  = 0;
				glw::GLint							retrieved_array_size  = 0;
				glw::GLint							retrieved_name_length = 0;
				glw::GLenum							retrieved_type		  = GL_NONE;
				glw::GLint							temp_buffer[2]		  = { 0, GL_NONE };

				/* Retrieve index of the iteration-specific uniform */
				glw::GLuint resource_index = gl.getProgramResourceIndex(po_id, GL_UNIFORM, current_item.name.c_str());
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramResourceIndex() call failed.");

				/* Make sure glGetProgramResourceName() returns correct values */
				memset(m_uniform_name_buffer, 0, max_uniform_name_length);

				gl.getProgramResourceName(po_id, GL_UNIFORM, /* interface */
										  resource_index, max_uniform_name_length, &retrieved_name_length,
										  m_uniform_name_buffer);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramResourceName() call failed.");

				if (current_item.name.length() != (glw::GLuint)retrieved_name_length ||
					memcmp(m_uniform_name_buffer, current_item.name.c_str(), retrieved_name_length) != 0)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid uniform name was reported at index ["
									   << resource_index << "]"
															": expected:["
									   << current_item.name << "]"
															   ", reported:["
									   << m_uniform_name_buffer << "]" << tcu::TestLog::EndMessage;

					result = false;
					continue;
				}

				/* Make sure glGetProgramResourceiv() returns correct values for GL_TYPE and GL_ARRAY_SIZE queries */
				gl.getProgramResourceiv(po_id, GL_UNIFORM, /* interface */
										resource_index, n_properties, properties,
										sizeof(temp_buffer) / sizeof(temp_buffer[0]), &n_written_items, temp_buffer);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramResourceiv() call failed.");

				if (n_written_items != n_properties)
				{
					TCU_FAIL("Invalid amount of items were reported by glGetProgramResourceiv() call.");
				}

				/* For clarity, copy the retrieved values to separate variables */
				retrieved_array_size = temp_buffer[0];
				retrieved_type		 = temp_buffer[1];

				/* Verify the values */
				if (retrieved_array_size != current_item.expected_array_size)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid array size reported for uniform ["
									   << current_item.name << "]"
									   << ": expected:[" << current_item.expected_array_size << "]"
																								", reported:["
									   << retrieved_array_size << "]" << tcu::TestLog::EndMessage;

					result = false;
				}

				if (retrieved_type != current_item.expected_type)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid type reported for uniform ["
									   << current_item.name << "]"
									   << ": expected:[" << current_item.expected_type << "]"
																						  ", reported:["
									   << retrieved_type << "]" << tcu::TestLog::EndMessage;

					result = false;
				}
			} /* for (all uniforms) */
		}	 /* for (all shader stages) */

		/* We're now OK to release the buffer we used to hold uniform names for
		 * the program */
		if (m_uniform_name_buffer != DE_NULL)
		{
			delete[] m_uniform_name_buffer;

			m_uniform_name_buffer = DE_NULL;
		}
	} /* for (both program objects) */

	return result;
}